

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<6,_11,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  int i;
  bool bVar5;
  long lVar6;
  undefined8 *puVar7;
  int col;
  long lVar8;
  undefined8 *puVar9;
  int col_1;
  undefined4 uVar10;
  float afStack_88 [4];
  Vector<float,_3> res;
  float local_68 [4];
  undefined8 local_58;
  undefined4 local_50;
  undefined8 local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38 [2];
  undefined1 local_28 [8];
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  puVar1 = (undefined8 *)((long)local_28 + 4);
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar6 = 0;
    puVar7 = (undefined8 *)local_28;
    bVar4 = true;
    do {
      bVar5 = bVar4;
      lVar8 = 0;
      do {
        uVar10 = 0x3f800000;
        if (lVar6 != lVar8) {
          uVar10 = 0;
        }
        *(undefined4 *)(puVar7 + lVar8) = uVar10;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar6 = 1;
      puVar7 = puVar1;
      bVar4 = false;
    } while (bVar5);
    local_28 = (undefined1  [8])*(undefined8 *)evalCtx->in[0].m_data;
    uStack_20 = *(undefined8 *)evalCtx->in[1].m_data;
    local_18 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_10 = *(undefined8 *)evalCtx->in[3].m_data;
  }
  else {
    local_18 = 0;
    uStack_10 = 0;
    local_28 = (undefined1  [8])0x0;
    uStack_20 = 0;
    lVar6 = 0;
    puVar7 = (undefined8 *)local_28;
    bVar4 = true;
    do {
      bVar5 = bVar4;
      lVar8 = 0;
      do {
        *(undefined4 *)(puVar7 + lVar8) =
             *(undefined4 *)((long)&s_constInMat4x2 + lVar6 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar6 = 0x10;
      puVar7 = puVar1;
      bVar4 = false;
    } while (bVar5);
  }
  local_38[0] = 0x3f800000;
  local_48._4_4_ = 0x3f800000;
  uStack_40 = 0;
  uStack_3c = 0;
  puVar7 = local_38;
  puVar9 = (undefined8 *)local_28;
  bVar4 = true;
  do {
    bVar5 = bVar4;
    uVar10 = *(undefined4 *)(puVar9 + 1);
    uVar2 = *(undefined4 *)(puVar9 + 2);
    uVar3 = *(undefined4 *)(puVar9 + 3);
    *(undefined4 *)puVar7 = *(undefined4 *)puVar9;
    *(undefined4 *)((long)puVar7 + 4) = uVar10;
    *(undefined4 *)(puVar7 + 1) = uVar2;
    *(undefined4 *)((long)puVar7 + 0xc) = uVar3;
    puVar7 = &local_48;
    puVar9 = puVar1;
    bVar4 = false;
  } while (bVar5);
  stack0xffffffffffffff90 = local_38[0];
  local_58 = CONCAT44(uStack_40,local_48._4_4_);
  local_50 = uStack_3c;
  afStack_88[2] = 0.0;
  afStack_88[3] = 0.0;
  res.m_data[0] = 0.0;
  lVar6 = 0;
  do {
    res.m_data[lVar6 + -2] = res.m_data[lVar6 + 2] + *(float *)((long)&local_58 + lVar6 * 4);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  lVar6 = 2;
  do {
    (evalCtx->color).m_data[(int)res.m_data[lVar6 + 2]] = afStack_88[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(transpose(in0));
	}